

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_socket_log.c
# Opt level: O3

void backend_socket_log(Seat *seat,LogContext *logctx,PlugLogType type,SockAddr *addr,int port,
                       char *error_msg,int error_code,Conf *conf,_Bool session_started)

{
  _Bool _Var1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  char local_128 [256];
  
  switch(type) {
  case PLUGLOG_CONNECT_TRYING:
    sk_getaddr(addr,local_128,0x100);
    _Var1 = sk_addr_needs_port(addr);
    if (!_Var1) {
      pcVar3 = "Connecting to %s";
      goto LAB_001674df;
    }
    pcVar3 = dupprintf("Connecting to %s port %d",local_128,(ulong)(uint)port);
    break;
  case PLUGLOG_CONNECT_FAILED:
    sk_getaddr(addr,local_128,0x100);
    pcVar3 = dupprintf("Failed to connect to %s: %s",local_128,error_msg);
    break;
  case PLUGLOG_CONNECT_SUCCESS:
    if (addr == (SockAddr *)0x0) {
      builtin_strncpy(local_128,"remote host",0xc);
    }
    else {
      sk_getaddr(addr,local_128,0x100);
    }
    pcVar3 = "Connected to %s";
LAB_001674df:
    pcVar3 = dupprintf(pcVar3,local_128);
    break;
  case PLUGLOG_PROXY_MSG:
    pcVar3 = dupprintf("%s\r\n",error_msg);
    sVar4 = strlen(pcVar3);
    if ((int)sVar4 < 2) {
      __assert_fail("len >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/backend_socket_log.c"
                    ,0x2a,
                    "void backend_socket_log(Seat *, LogContext *, PlugLogType, SockAddr *, int, const char *, int, Conf *, _Bool)"
                   );
    }
    uVar2 = conf_get_int(conf,0x13);
    uVar5 = (uint)session_started;
    if (uVar2 != 2) {
      uVar5 = uVar2;
    }
    if (uVar5 == 0) {
      (*seat->vt->output)(seat,SEAT_OUTPUT_STDERR,pcVar3,(ulong)sVar4 & 0x7fffffff);
    }
    pcVar3[(int)sVar4 - 2] = '\0';
    goto LAB_001674f1;
  default:
    goto switchD_001673bd_default;
  }
  if (pcVar3 != (char *)0x0) {
LAB_001674f1:
    logevent(logctx,pcVar3);
    safefree(pcVar3);
  }
switchD_001673bd_default:
  return;
}

Assistant:

void backend_socket_log(Seat *seat, LogContext *logctx,
                        PlugLogType type, SockAddr *addr, int port,
                        const char *error_msg, int error_code, Conf *conf,
                        bool session_started)
{
    char addrbuf[256], *msg;

    switch (type) {
      case PLUGLOG_CONNECT_TRYING:
        sk_getaddr(addr, addrbuf, lenof(addrbuf));
        if (sk_addr_needs_port(addr)) {
            msg = dupprintf("Connecting to %s port %d", addrbuf, port);
        } else {
            msg = dupprintf("Connecting to %s", addrbuf);
        }
        break;
      case PLUGLOG_CONNECT_FAILED:
        sk_getaddr(addr, addrbuf, lenof(addrbuf));
        msg = dupprintf("Failed to connect to %s: %s", addrbuf, error_msg);
        break;
      case PLUGLOG_CONNECT_SUCCESS:
        if (addr)
            sk_getaddr(addr, addrbuf, lenof(addrbuf));
        else /* fallback if address unavailable */
            sprintf(addrbuf, "remote host");
        msg = dupprintf("Connected to %s", addrbuf);
        break;
      case PLUGLOG_PROXY_MSG: {
        /* Proxy-related log messages have their own identifying
         * prefix already, put on by our caller. */
        int len, log_to_term;

        /* Suffix \r\n temporarily, so we can log to the terminal. */
        msg = dupprintf("%s\r\n", error_msg);
        len = strlen(msg);
        assert(len >= 2);

        log_to_term = conf_get_int(conf, CONF_proxy_log_to_term);
        if (log_to_term == AUTO)
            log_to_term = session_started ? FORCE_OFF : FORCE_ON;
        if (log_to_term == FORCE_ON)
            seat_stderr(seat, msg, len);

        msg[len-2] = '\0';         /* remove the \r\n again */
        break;
      }
      default:
        msg = NULL;  /* shouldn't happen, but placate optimiser */
        break;
    }

    if (msg) {
        logevent(logctx, msg);
        sfree(msg);
    }
}